

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O1

int RenderTest_RadianceMatches_Test::AddToRegistry(void)

{
  UnitTest *this;
  ParameterizedTestCaseRegistry *this_00;
  ParameterizedTestCaseInfo<RenderTest> *this_01;
  TestMetaFactoryBase<TestIntegrator> *meta_factory;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  this_01 = testing::internal::ParameterizedTestCaseRegistry::GetTestCasePatternHolder<RenderTest>
                      (this_00,"RenderTest",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/integrators_test.cpp"
                       ,0x1a0);
  meta_factory = (TestMetaFactoryBase<TestIntegrator> *)operator_new(8);
  meta_factory->_vptr_TestMetaFactoryBase = (_func_int **)&PTR__TestMetaFactoryBase_03155738;
  testing::internal::ParameterizedTestCaseInfo<RenderTest>::AddTestPattern
            (this_01,"RenderTest","RadianceMatches",meta_factory);
  return 0;
}

Assistant:

TEST_P(RenderTest, RadianceMatches) {
    const TestIntegrator &tr = GetParam();
    tr.integrator->Render();
    CheckSceneAverage(inTestDir("test.exr"), tr.scene.expected);
    // The SpatialLightSampler class keeps a per-thread cache that
    // must be cleared out between test runs. In turn, this means that we
    // must delete the Integrator here in order to make sure that its
    // destructor runs. (This is ugly and should be fixed in a better way.)
    delete tr.integrator;

    EXPECT_EQ(0, remove(inTestDir("test.exr").c_str()));
}